

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpmemorymanager.h
# Opt level: O2

void jrtplib::RTPDelete<jrtplib::RTPUDPv4Transmitter::PortInfo>(PortInfo *obj,RTPMemoryManager *mgr)

{
  if (mgr != (RTPMemoryManager *)0x0) {
    std::__cxx11::_List_base<unsigned_short,_std::allocator<unsigned_short>_>::_M_clear
              (&(obj->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>);
    (**(code **)(*(long *)mgr + 0x18))(mgr,obj);
    return;
  }
  if (obj != (PortInfo *)0x0) {
    std::__cxx11::_List_base<unsigned_short,_std::allocator<unsigned_short>_>::_M_clear
              (&(obj->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>);
  }
  operator_delete(obj,0x20);
  return;
}

Assistant:

inline void RTPDelete(ClassName *obj, RTPMemoryManager *mgr)
{
	if (mgr == 0)
		delete obj;
	else
	{
		obj->~ClassName();
		mgr->FreeBuffer(obj);
	}
}